

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object.hpp
# Opt level: O2

Boxed_Value * __thiscall
chaiscript::dispatch::Dynamic_Object::method_missing(Dynamic_Object *this,string *t_method_name)

{
  iterator iVar1;
  mapped_type *pmVar2;
  option_explicit_set *this_00;
  
  if (this->m_option_explicit == true) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
            ::find(&(this->m_attrs)._M_t,t_method_name);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->m_attrs)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (option_explicit_set *)__cxa_allocate_exception(0x10);
      option_explicit_set::option_explicit_set(this_00,t_method_name);
      __cxa_throw(this_00,&option_explicit_set::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
           ::operator[](&this->m_attrs,t_method_name);
  return pmVar2;
}

Assistant:

Boxed_Value &method_missing(const std::string &t_method_name) {
        if (m_option_explicit && m_attrs.find(t_method_name) == m_attrs.end()) {
          throw option_explicit_set(t_method_name);
        }

        return get_attr(t_method_name);
      }